

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall sglr::ReferenceContext::deleteTexture(ReferenceContext *this,Texture *texture)

{
  ObjectManager<sglr::rc::Texture> *this_00;
  Attachment *attachment;
  Texture *pTVar1;
  Framebuffer *pFVar2;
  Framebuffer *pFVar3;
  bool bVar4;
  bool bVar5;
  pointer pTVar6;
  pointer pTVar7;
  int point;
  long lVar8;
  Framebuffer *pFVar9;
  int iVar10;
  long lVar11;
  
  pTVar6 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_textureUnits).
                              super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar6) >> 3) *
          0x2392e827) {
    this_00 = &this->m_textures;
    lVar8 = 0x28;
    lVar11 = 0;
    do {
      pTVar1 = *(Texture **)((long)pTVar6 + lVar8 + -0x28);
      if (pTVar1 == texture) {
        if (texture != (Texture *)0x0) {
          rc::ObjectManager<sglr::rc::Texture>::releaseReference(this_00,pTVar1);
          pTVar6 = (this->m_textureUnits).
                   super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pTVar7 = pTVar6 + lVar11;
          goto LAB_00811e8d;
        }
      }
      else {
        pTVar1 = *(Texture **)((long)pTVar6 + lVar8 + -0x20);
        if (pTVar1 == texture) {
          if (texture != (Texture *)0x0) {
            rc::ObjectManager<sglr::rc::Texture>::releaseReference(this_00,pTVar1);
            pTVar6 = (this->m_textureUnits).
                     super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pTVar7 = (pointer)&pTVar6[lVar11].tex2DBinding;
            goto LAB_00811e8d;
          }
        }
        else {
          pTVar1 = *(Texture **)((long)pTVar6 + lVar8 + -0x18);
          if (pTVar1 == texture) {
            if (texture != (Texture *)0x0) {
              rc::ObjectManager<sglr::rc::Texture>::releaseReference(this_00,pTVar1);
              pTVar6 = (this->m_textureUnits).
                       super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pTVar7 = (pointer)&pTVar6[lVar11].texCubeBinding;
              goto LAB_00811e8d;
            }
          }
          else {
            pTVar1 = *(Texture **)((long)pTVar6 + lVar8 + -0x10);
            if (pTVar1 == texture) {
              if (texture != (Texture *)0x0) {
                rc::ObjectManager<sglr::rc::Texture>::releaseReference(this_00,pTVar1);
                pTVar6 = (this->m_textureUnits).
                         super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pTVar7 = (pointer)&pTVar6[lVar11].tex2DArrayBinding;
                goto LAB_00811e8d;
              }
            }
            else {
              pTVar1 = *(Texture **)((long)pTVar6 + lVar8 + -8);
              if (pTVar1 == texture) {
                if (texture != (Texture *)0x0) {
                  rc::ObjectManager<sglr::rc::Texture>::releaseReference(this_00,pTVar1);
                  pTVar6 = (this->m_textureUnits).
                           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pTVar7 = (pointer)&pTVar6[lVar11].tex3DBinding;
                  goto LAB_00811e8d;
                }
              }
              else {
                pTVar1 = *(Texture **)((long)&pTVar6->tex1DBinding + lVar8);
                if (pTVar1 == texture && texture != (Texture *)0x0) {
                  rc::ObjectManager<sglr::rc::Texture>::releaseReference(this_00,pTVar1);
                  pTVar6 = (this->m_textureUnits).
                           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pTVar7 = (pointer)((long)&pTVar6->tex1DBinding + lVar8);
LAB_00811e8d:
                  pTVar7->tex1DBinding = (Texture1D *)0x0;
                }
              }
            }
          }
        }
      }
      lVar11 = lVar11 + 1;
      lVar8 = lVar8 + 0x3cb8;
    } while (lVar11 < (int)((ulong)((long)(this->m_textureUnits).
                                          super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar6)
                           >> 3) * 0x2392e827);
  }
  bVar5 = true;
  do {
    bVar4 = bVar5;
    pFVar2 = this->m_readFramebufferBinding;
    pFVar3 = this->m_drawFramebufferBinding;
    pFVar9 = pFVar3;
    if (bVar4) {
      pFVar9 = pFVar2;
    }
    if (pFVar9 != (Framebuffer *)0x0) {
      lVar8 = 0;
      do {
        if (pFVar9->m_attachments[lVar8].name == (texture->super_NamedObject).m_name) {
          attachment = pFVar9->m_attachments + lVar8;
          for (iVar10 = (uint)(pFVar9 == pFVar2) + (uint)(pFVar9 == pFVar3); iVar10 != 0;
              iVar10 = iVar10 + -1) {
            releaseFboAttachmentReference(this,attachment);
          }
          attachment->type = ATTACHMENTTYPE_LAST;
          attachment->name = 0;
          attachment->texTarget = TEXTARGET_LAST;
          attachment->level = 0;
          attachment->layer = 0;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
    }
    bVar5 = false;
  } while (bVar4);
  rc::ObjectManager<sglr::rc::Texture>::releaseReference(&this->m_textures,texture);
  return;
}

Assistant:

void ReferenceContext::deleteTexture (Texture* texture)
{
	// Unbind from context
	for (int unitNdx = 0; unitNdx < (int)m_textureUnits.size(); unitNdx++)
	{
		if (m_textureUnits[unitNdx].tex1DBinding				== texture)	setTex1DBinding			(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].tex2DBinding			== texture)	setTex2DBinding			(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].texCubeBinding			== texture)	setTexCubeBinding		(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].tex2DArrayBinding		== texture)	setTex2DArrayBinding	(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].tex3DBinding			== texture)	setTex3DBinding			(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].texCubeArrayBinding	== texture)	setTexCubeArrayBinding	(unitNdx, DE_NULL);
	}

	// Unbind from currently bound framebuffers
	for (int ndx = 0; ndx < 2; ndx++)
	{
		rc::Framebuffer* framebufferBinding = ndx ? m_drawFramebufferBinding : m_readFramebufferBinding;
		if (framebufferBinding)
		{
			int releaseRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
								+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

			for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
			{
				Framebuffer::Attachment& attachment = framebufferBinding->getAttachment((Framebuffer::AttachmentPoint)point);
				if (attachment.name == texture->getName())
				{
					for (int refNdx = 0; refNdx < releaseRefCount; refNdx++)
						releaseFboAttachmentReference(attachment);
					attachment = Framebuffer::Attachment();
				}
			}
		}
	}

	DE_ASSERT(texture->getRefCount() == 1);
	m_textures.releaseReference(texture);
}